

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

void __thiscall kj::_::NetworkFilter::NetworkFilter(NetworkFilter *this)

{
  Vector<kj::_::CidrRange> *this_00;
  RemoveConst<kj::_::CidrRange> **ppRVar1;
  CidrRange *pCVar2;
  CidrRange *pCVar3;
  RemoveConst<kj::_::CidrRange> *pRVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  ulong newSize;
  ArrayPtr<const_kj::_::CidrRange> AVar8;
  ArrayPtr<const_unsigned_char> bits;
  uchar local_44 [4];
  CidrRange local_40;
  
  (this->super_NetworkFilter)._vptr_NetworkFilter = (_func_int **)&PTR_shouldAllow_00466528;
  this_00 = &this->allowCidrs;
  (this->allowCidrs).builder.ptr = (CidrRange *)0x0;
  (this->allowCidrs).builder.pos = (RemoveConst<kj::_::CidrRange> *)0x0;
  (this->allowCidrs).builder.endPtr = (CidrRange *)0x0;
  (this->denyCidrs).builder.ptr = (CidrRange *)0x0;
  (this->denyCidrs).builder.pos = (RemoveConst<kj::_::CidrRange> *)0x0;
  (this->denyCidrs).builder.endPtr = (CidrRange *)0x0;
  this->allowUnix = true;
  this->allowAbstractUnix = true;
  (this->next).ptr = (NetworkFilter *)0x0;
  local_44[0] = '\0';
  local_44[1] = '\0';
  local_44[2] = '\0';
  local_44[3] = '\0';
  bits.size_ = 4;
  bits.ptr = local_44;
  CidrRange::CidrRange(&local_40,2,bits,0);
  pCVar2 = (this->allowCidrs).builder.endPtr;
  if ((this->allowCidrs).builder.pos == pCVar2) {
    pCVar3 = (this_00->builder).ptr;
    sVar6 = 4;
    if (pCVar2 != pCVar3) {
      sVar6 = ((long)pCVar2 - (long)pCVar3 >> 3) * 0x5555555555555556;
    }
    Vector<kj::_::CidrRange>::setCapacity(this_00,sVar6);
  }
  pRVar4 = (this->allowCidrs).builder.pos;
  *(undefined8 *)(pRVar4->bits + 0xc) = local_40._16_8_;
  pRVar4->family = local_40.family;
  pRVar4->bits[0] = local_40.bits[0];
  pRVar4->bits[1] = local_40.bits[1];
  pRVar4->bits[2] = local_40.bits[2];
  pRVar4->bits[3] = local_40.bits[3];
  *(undefined8 *)(pRVar4->bits + 4) = local_40.bits._4_8_;
  ppRVar1 = &(this->allowCidrs).builder.pos;
  *ppRVar1 = *ppRVar1 + 1;
  CidrRange::inet6(&local_40,(ArrayPtr<const_unsigned_short>)ZEXT816(0),
                   (ArrayPtr<const_unsigned_short>)ZEXT816(0),0);
  pCVar2 = (this->allowCidrs).builder.endPtr;
  if ((this->allowCidrs).builder.pos == pCVar2) {
    pCVar3 = (this_00->builder).ptr;
    sVar6 = 4;
    if (pCVar2 != pCVar3) {
      sVar6 = ((long)pCVar2 - (long)pCVar3 >> 3) * 0x5555555555555556;
    }
    Vector<kj::_::CidrRange>::setCapacity(this_00,sVar6);
  }
  pRVar4 = (this->allowCidrs).builder.pos;
  *(undefined8 *)(pRVar4->bits + 0xc) = local_40._16_8_;
  pRVar4->family = local_40.family;
  pRVar4->bits[0] = local_40.bits[0];
  pRVar4->bits[1] = local_40.bits[1];
  pRVar4->bits[2] = local_40.bits[2];
  pRVar4->bits[3] = local_40.bits[3];
  *(undefined8 *)(pRVar4->bits + 4) = local_40.bits._4_8_;
  ppRVar1 = &(this->allowCidrs).builder.pos;
  *ppRVar1 = *ppRVar1 + 1;
  AVar8 = reservedCidrs();
  sVar6 = AVar8.size_;
  pCVar2 = (this->denyCidrs).builder.ptr;
  uVar5 = ((long)(this->denyCidrs).builder.pos - (long)pCVar2 >> 3) * -0x5555555555555555 + sVar6;
  pCVar3 = (this->denyCidrs).builder.endPtr;
  lVar7 = (long)pCVar3 - (long)pCVar2 >> 3;
  if ((ulong)(lVar7 * -0x5555555555555555) < uVar5) {
    newSize = 4;
    if (pCVar3 != pCVar2) {
      newSize = lVar7 * 0x5555555555555556;
    }
    if (newSize < uVar5) {
      newSize = uVar5;
    }
    Vector<kj::_::CidrRange>::setCapacity(&this->denyCidrs,newSize);
  }
  pRVar4 = (this->denyCidrs).builder.pos;
  if (sVar6 != 0) {
    memcpy(pRVar4,AVar8.ptr,sVar6 * 0x18);
  }
  (this->denyCidrs).builder.pos = pRVar4 + sVar6;
  return;
}

Assistant:

NetworkFilter::NetworkFilter()
    : allowUnix(true), allowAbstractUnix(true) {
  allowCidrs.add(CidrRange::inet4({0,0,0,0}, 0));
  allowCidrs.add(CidrRange::inet6({}, {}, 0));
  denyCidrs.addAll(reservedCidrs());
}